

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O2

void occ_doit<occurrence>(occurrence *q)

{
  int iVar1;
  short sVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  int occ_day;
  int occ_month;
  int occ_year;
  
  sVar4 = fread(q,0xc,1,_stdin);
  while (iVar3 = granular_date_, (int)sVar4 != 0) {
    iVar1 = q->occ_date_id;
    iVar5 = 0x5a0;
    if (granular_date_ == 0) {
      iVar5 = 1;
    }
    d((long)(iVar1 / iVar5),&occ_year,&occ_month,&occ_day);
    if (iVar3 == 0) {
      printf("%d,%d,%d,%d,%d\n",(ulong)(uint)q->event_id,(ulong)(uint)q->period_no,
             (ulong)(uint)occ_year,(ulong)(uint)occ_month,(ulong)(uint)occ_day);
    }
    else {
      sVar2 = (short)((long)iVar1 % 0x5a0);
      printf("%d,%d,%d,%d,%d,%d,%d\n",(ulong)(uint)q->event_id,(ulong)(uint)q->period_no,
             (ulong)(uint)occ_year,(ulong)(uint)occ_month,(ulong)(uint)occ_day,
             (ulong)(uint)(int)(sVar2 / 0x3c),(ulong)(uint)(int)(sVar2 % 0x3c));
    }
    sVar4 = fread(q,0xc,1,_stdin);
  }
  return;
}

Assistant:

void occ_doit(T &q)
{

	int occ_year, occ_month, occ_day;
	int occ_hour = 0;
	int occ_minute = 0;
	int i = fread(&q, sizeof(q), 1, stdin);
	while (i != 0) {
		int days = q.occ_date_id / (1440 - 1439 * !granular_date_);
		d(days, occ_year, occ_month, occ_day);
		if (granular_date_) {
			int minutes = q.occ_date_id % 1440;
			occ_hour = minutes / 60;
			occ_minute = minutes % 60;
			printf("%d,%d,%d,%d,%d,%d,%d\n", q.event_id,
			       q.period_no, occ_year, occ_month, occ_day,
			       occ_hour, occ_minute);
		} else {
			printf("%d,%d,%d,%d,%d\n",  q.event_id, q.period_no,
			       occ_year, occ_month, occ_day);
		}
		i = fread(&q, sizeof(q), 1, stdin);
	}

}